

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O2

void __thiscall SDLFB::Update(SDLFB *this)

{
  int iVar1;
  int y;
  int pitch;
  void *pixels;
  
  iVar1 = (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.LockCount;
  if (iVar1 == 1) {
    DFrameBuffer::DrawRateStuff(&this->super_DFrameBuffer);
    if ((vid_maxfps.Value != 0) && (cl_capfps.Value == false)) {
      do {
        do {
          iVar1 = sem_wait((sem_t *)&FPSLimitSemaphore);
        } while (iVar1 != 0);
        sem_getvalue((sem_t *)&FPSLimitSemaphore,(int *)&pixels);
      } while (0 < (int)pixels);
    }
    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Buffer = (BYTE *)0x0;
    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.LockCount = 0;
    this->UpdatePending = false;
    BlitCycles.Sec = 0.0;
    SDLFlipCycles.Sec = 0.0;
    cycle_t::Clock(&BlitCycles);
    if (this->UsingRenderer == true) {
      iVar1 = SDL_LockTexture((this->field_8).Texture,0,&pixels,&pitch);
      if (iVar1 != 0) {
        return;
      }
    }
    else {
      iVar1 = SDL_LockSurface((this->field_8).Texture);
      if (iVar1 != 0) {
        return;
      }
      pixels = ((this->field_8).Surface)->pixels;
      pitch = ((this->field_8).Surface)->pitch;
    }
    if (this->NotPaletted == true) {
      (*GPfx.Convert)((this->super_DFrameBuffer).super_DSimpleCanvas.MemBuffer,
                      (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Pitch,pixels,
                      pitch,(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width,
                      (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height,0x10000,
                      0x10000,0,0);
    }
    else if (pitch == (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Pitch) {
      memcpy(pixels,(this->super_DFrameBuffer).super_DSimpleCanvas.MemBuffer,
             (long)(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height *
             (long)(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width);
    }
    else {
      for (iVar1 = 0; iVar1 < (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height;
          iVar1 = iVar1 + 1) {
        memcpy((void *)((long)pitch * (long)iVar1 + (long)pixels),
               (this->super_DFrameBuffer).super_DSimpleCanvas.MemBuffer +
               (long)(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Pitch *
               (long)iVar1,(long)(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width)
        ;
      }
    }
    if (this->UsingRenderer == true) {
      SDL_UnlockTexture();
      cycle_t::Clock(&SDLFlipCycles);
      SDL_RenderClear(this->Renderer);
      SDL_RenderCopy(this->Renderer,(this->field_8).Texture,0,0);
      SDL_RenderPresent(this->Renderer);
    }
    else {
      SDL_UnlockSurface((this->field_8).Texture);
      cycle_t::Clock(&SDLFlipCycles);
      SDL_UpdateWindowSurface(this->Screen);
    }
    cycle_t::Unclock(&SDLFlipCycles);
    cycle_t::Unclock(&BlitCycles);
    if (this->NeedGammaUpdate == true) {
      this->NeedGammaUpdate = false;
      DCanvas::CalcGamma((DCanvas *)this,
                         (float)(-(uint)(rgamma.Value == 0.0) & (uint)this->Gamma |
                                ~-(uint)(rgamma.Value == 0.0) & (uint)(rgamma.Value * this->Gamma)),
                         this->GammaTable[0]);
      DCanvas::CalcGamma((DCanvas *)this,
                         (float)(-(uint)(ggamma.Value == 0.0) & (uint)this->Gamma |
                                ~-(uint)(ggamma.Value == 0.0) & (uint)(ggamma.Value * this->Gamma)),
                         this->GammaTable[1]);
      DCanvas::CalcGamma((DCanvas *)this,
                         (float)(-(uint)(bgamma.Value == 0.0) & (uint)this->Gamma |
                                ~-(uint)(bgamma.Value == 0.0) & (uint)(bgamma.Value * this->Gamma)),
                         this->GammaTable[2]);
    }
    else if ((this->NeedPalUpdate & 1U) == 0) {
      return;
    }
    this->NeedPalUpdate = false;
    UpdateColors(this);
  }
  else if (0 < iVar1) {
    this->UpdatePending = true;
    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.LockCount = iVar1 + -1;
  }
  return;
}

Assistant:

void SDLFB::Update ()
{
	if (LockCount != 1)
	{
		if (LockCount > 0)
		{
			UpdatePending = true;
			--LockCount;
		}
		return;
	}

	DrawRateStuff ();

#ifndef __APPLE__
	if(vid_maxfps && !cl_capfps)
	{
		SEMAPHORE_WAIT(FPSLimitSemaphore)
	}
#endif

	Buffer = NULL;
	LockCount = 0;
	UpdatePending = false;

	BlitCycles.Reset();
	SDLFlipCycles.Reset();
	BlitCycles.Clock();

	void *pixels;
	int pitch;
	if (UsingRenderer)
	{
		if (SDL_LockTexture (Texture, NULL, &pixels, &pitch))
			return;
	}
	else
	{
		if (SDL_LockSurface (Surface))
			return;

		pixels = Surface->pixels;
		pitch = Surface->pitch;
	}

	if (NotPaletted)
	{
		GPfx.Convert (MemBuffer, Pitch,
			pixels, pitch, Width, Height,
			FRACUNIT, FRACUNIT, 0, 0);
	}
	else
	{
		if (pitch == Pitch)
		{
			memcpy (pixels, MemBuffer, Width*Height);
		}
		else
		{
			for (int y = 0; y < Height; ++y)
			{
				memcpy ((BYTE *)pixels+y*pitch, MemBuffer+y*Pitch, Width);
			}
		}
	}

	if (UsingRenderer)
	{
		SDL_UnlockTexture (Texture);

		SDLFlipCycles.Clock();
		SDL_RenderClear(Renderer);
		SDL_RenderCopy(Renderer, Texture, NULL, NULL);
		SDL_RenderPresent(Renderer);
		SDLFlipCycles.Unclock();
	}
	else
	{
		SDL_UnlockSurface (Surface);

		SDLFlipCycles.Clock();
		SDL_UpdateWindowSurface (Screen);
		SDLFlipCycles.Unclock();
	}

	BlitCycles.Unclock();

	if (NeedGammaUpdate)
	{
		bool Windowed = false;
		NeedGammaUpdate = false;
		CalcGamma ((Windowed || rgamma == 0.f) ? Gamma : (Gamma * rgamma), GammaTable[0]);
		CalcGamma ((Windowed || ggamma == 0.f) ? Gamma : (Gamma * ggamma), GammaTable[1]);
		CalcGamma ((Windowed || bgamma == 0.f) ? Gamma : (Gamma * bgamma), GammaTable[2]);
		NeedPalUpdate = true;
	}
	
	if (NeedPalUpdate)
	{
		NeedPalUpdate = false;
		UpdateColors ();
	}
}